

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ArrayFeatureType::InternalSwap
          (ArrayFeatureType *this,ArrayFeatureType *other)

{
  DefaultOptionalValueUnion DVar1;
  int iVar2;
  uint32_t uVar3;
  intptr_t iVar4;
  ShapeFlexibilityUnion SVar5;
  void *pvVar6;
  void *pvVar7;
  int iVar8;
  int iVar9;
  LogMessage *other_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  iVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar4;
  if (this == other) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    other_00 = google::protobuf::internal::LogMessage::operator<<
                         (&local_50,"CHECK failed: this != other: ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other_00);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar8 = (this->shape_).current_size_;
  iVar9 = (this->shape_).total_size_;
  pvVar6 = (this->shape_).arena_or_elements_;
  iVar2 = (other->shape_).total_size_;
  pvVar7 = (other->shape_).arena_or_elements_;
  (this->shape_).current_size_ = (other->shape_).current_size_;
  (this->shape_).total_size_ = iVar2;
  (this->shape_).arena_or_elements_ = pvVar7;
  (other->shape_).current_size_ = iVar8;
  (other->shape_).total_size_ = iVar9;
  (other->shape_).arena_or_elements_ = pvVar6;
  iVar2 = this->datatype_;
  this->datatype_ = other->datatype_;
  other->datatype_ = iVar2;
  SVar5 = this->ShapeFlexibility_;
  this->ShapeFlexibility_ = other->ShapeFlexibility_;
  other->ShapeFlexibility_ = SVar5;
  DVar1 = this->defaultOptionalValue_;
  this->defaultOptionalValue_ = other->defaultOptionalValue_;
  other->defaultOptionalValue_ = DVar1;
  uVar3 = this->_oneof_case_[0];
  this->_oneof_case_[0] = other->_oneof_case_[0];
  other->_oneof_case_[0] = uVar3;
  uVar3 = this->_oneof_case_[1];
  this->_oneof_case_[1] = other->_oneof_case_[1];
  other->_oneof_case_[1] = uVar3;
  return;
}

Assistant:

void ArrayFeatureType::InternalSwap(ArrayFeatureType* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  shape_.InternalSwap(&other->shape_);
  swap(datatype_, other->datatype_);
  swap(ShapeFlexibility_, other->ShapeFlexibility_);
  swap(defaultOptionalValue_, other->defaultOptionalValue_);
  swap(_oneof_case_[0], other->_oneof_case_[0]);
  swap(_oneof_case_[1], other->_oneof_case_[1]);
}